

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
ipx::Model::DualizeBackBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,Vector *x_user,
          Vector *slack_user,Vector *y_user,Vector *z_user)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  
  iVar1 = this->num_cols_;
  if (this->dualized_ == true) {
    sVar2 = x_user->_M_size;
    sVar8 = y_solver->_M_size;
    if (sVar2 == sVar8) {
      if (sVar2 != 0) {
        pdVar4 = x_user->_M_data;
        pdVar5 = y_solver->_M_data;
        sVar8 = 0;
        do {
          pdVar4[sVar8] = -pdVar5[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
      }
    }
    else {
      if (x_user->_M_data != (double *)0x0) {
        operator_delete(x_user->_M_data);
        sVar8 = y_solver->_M_size;
      }
      x_user->_M_size = sVar8;
      pdVar4 = (double *)operator_new(sVar8 << 3);
      x_user->_M_data = pdVar4;
      sVar2 = x_user->_M_size;
      if (sVar2 != 0) {
        pdVar5 = y_solver->_M_data;
        sVar8 = 0;
        do {
          pdVar4[sVar8] = -pdVar5[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
      }
    }
    lVar7 = (long)this->num_constr_;
    if (0 < lVar7) {
      pdVar4 = z_solver->_M_data;
      pdVar5 = slack_user->_M_data;
      lVar9 = 0;
      do {
        pdVar5[lVar9] = -pdVar4[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
      pdVar4 = (double *)y_user->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = y_user->_M_data;
      }
      pdVar5 = (double *)x_solver->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_solver->_M_data;
      }
      memmove(pdVar4,pdVar5,lVar7 << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar4 = (double *)z_user->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = z_user->_M_data;
      }
      pdVar5 = (double *)x_solver->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_solver->_M_data;
      }
      memmove(pdVar4,pdVar5 + iVar1,(long)this->num_var_ << 3);
    }
    piVar6 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar6 != piVar3) {
      pdVar4 = z_user->_M_data;
      pdVar5 = x_solver->_M_data + this->num_constr_;
      do {
        pdVar4[*piVar6] = pdVar4[*piVar6] - *pdVar5;
        piVar6 = piVar6 + 1;
        pdVar5 = pdVar5 + 1;
      } while (piVar6 != piVar3);
    }
  }
  else {
    if (0 < (long)this->num_var_) {
      pdVar4 = (double *)x_user->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = x_user->_M_data;
      }
      pdVar5 = (double *)x_solver->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_solver->_M_data;
      }
      memmove(pdVar4,pdVar5,(long)this->num_var_ << 3);
    }
    if (0 < (long)this->num_constr_) {
      pdVar4 = (double *)slack_user->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = slack_user->_M_data;
      }
      pdVar5 = (double *)x_solver->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_solver->_M_data;
      }
      memmove(pdVar4,pdVar5 + iVar1,(long)this->num_constr_ << 3);
      if (0 < (long)this->num_constr_) {
        pdVar4 = (double *)y_user->_M_size;
        if (pdVar4 != (double *)0x0) {
          pdVar4 = y_user->_M_data;
        }
        pdVar5 = (double *)y_solver->_M_size;
        if (pdVar5 != (double *)0x0) {
          pdVar5 = y_solver->_M_data;
        }
        memmove(pdVar4,pdVar5,(long)this->num_constr_ << 3);
      }
    }
    if (0 < (long)this->num_var_) {
      pdVar4 = (double *)z_user->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = z_user->_M_data;
      }
      pdVar5 = (double *)z_solver->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = z_solver->_M_data;
      }
      memmove(pdVar4,pdVar5,(long)this->num_var_ << 3);
      return;
    }
  }
  return;
}

Assistant:

void Model::DualizeBackBasicSolution(const Vector& x_solver,
                                     const Vector& y_solver,
                                     const Vector& z_solver,
                                     Vector& x_user,
                                     Vector& slack_user,
                                     Vector& y_user,
                                     Vector& z_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;
        for (Int i = 0; i < num_constr_; i++)
            slack_user[i] = -z_solver[i];
        std::copy_n(std::begin(x_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(x_solver) + n, num_var_, std::begin(z_user));
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            z_user[j] -= x_solver[k++];
        assert(k == n);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));
        std::copy_n(std::begin(x_solver) + n, num_constr_,
                    std::begin(slack_user));
        std::copy_n(std::begin(y_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(z_solver), num_var_, std::begin(z_user));
    }
}